

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_cmp_abs(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = X->n;
  do {
    uVar4 = uVar1;
    if (uVar4 == 0) break;
    uVar1 = uVar4 - 1;
  } while (X->p[uVar4 - 1] == 0);
  uVar1 = Y->n;
  do {
    uVar3 = uVar1;
    if (uVar3 == 0) break;
    uVar1 = uVar3 - 1;
  } while (Y->p[uVar3 - 1] == 0);
  iVar2 = 0;
  if (uVar3 != 0 || uVar4 != 0) {
    if (uVar3 < uVar4) {
      return 1;
    }
    if (uVar3 <= uVar4) {
      do {
        bVar5 = uVar4 == 0;
        uVar4 = uVar4 - 1;
        if (bVar5) {
          return 0;
        }
        if (Y->p[uVar4] < X->p[uVar4]) {
          return 1;
        }
      } while (Y->p[uVar4] <= X->p[uVar4]);
    }
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_cmp_abs( const mbedtls_mpi *X, const mbedtls_mpi *Y )
{
    size_t i, j;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( Y != NULL );

    for( i = X->n; i > 0; i-- )
        if( X->p[i - 1] != 0 )
            break;

    for( j = Y->n; j > 0; j-- )
        if( Y->p[j - 1] != 0 )
            break;

    if( i == 0 && j == 0 )
        return( 0 );

    if( i > j ) return(  1 );
    if( j > i ) return( -1 );

    for( ; i > 0; i-- )
    {
        if( X->p[i - 1] > Y->p[i - 1] ) return(  1 );
        if( X->p[i - 1] < Y->p[i - 1] ) return( -1 );
    }

    return( 0 );
}